

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

xmlURIPtr xmlParseURIRaw(char *str,int raw)

{
  int iVar1;
  xmlURIPtr uri;
  
  if ((str != (char *)0x0) && (uri = xmlCreateURI(), uri != (xmlURIPtr)0x0)) {
    if (raw != 0) {
      *(byte *)&uri->cleanup = (byte)uri->cleanup | 2;
    }
    iVar1 = xmlParse3986URIReference(uri,str);
    if (iVar1 == 0) {
      return uri;
    }
    xmlFreeURI(uri);
  }
  return (xmlURIPtr)0x0;
}

Assistant:

xmlURIPtr
xmlParseURIRaw(const char *str, int raw) {
    xmlURIPtr uri;
    int ret;

    if (str == NULL)
	return(NULL);
    uri = xmlCreateURI();
    if (uri != NULL) {
        if (raw) {
	    uri->cleanup |= 2;
	}
	ret = xmlParseURIReference(uri, str);
        if (ret) {
	    xmlFreeURI(uri);
	    return(NULL);
	}
    }
    return(uri);
}